

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

ssize_t __thiscall dtc::fdt::property::write(property *this,int __fd,void *__buf,size_t __n)

{
  pointer ppVar1;
  uint32_t uVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  output_writer *this_00;
  pointer this_01;
  byte_buffer value_buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this_00 = (output_writer *)CONCAT44(in_register_00000034,__fd);
  dtb::output_writer::write_token(this_00,FDT_PROP);
  value_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  value_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (this->values).
           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->values).
                 super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != ppVar1; this_01 = this_01 + 1
      ) {
    property_value::push_to_buffer(this_01,&value_buffer);
  }
  (*this_00->_vptr_output_writer[4])
            (this_00,(ulong)(uint)((int)value_buffer.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (int)value_buffer.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
  (*this_00->_vptr_output_writer[1])(this_00,this);
  uVar2 = dtb::string_table::add_string((string_table *)__buf,&this->key);
  (*this_00->_vptr_output_writer[4])(this_00,(ulong)uVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,&value_buffer);
  dtb::output_writer::write_data(this_00,(byte_buffer *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&value_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return extraout_RAX;
}

Assistant:

void
property::write(dtb::output_writer &writer, dtb::string_table &strings)
{
	writer.write_token(dtb::FDT_PROP);
	byte_buffer value_buffer;
	for (value_iterator i=begin(), e=end() ; i!=e ; ++i)
	{
		i->push_to_buffer(value_buffer);
	}
	writer.write_data((uint32_t)value_buffer.size());
	writer.write_comment(key);
	writer.write_data(strings.add_string(key));
	writer.write_data(value_buffer);
}